

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O0

int __thiscall Zuker::fill_rna(Zuker *this,int index)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int idx;
  double max_cai;
  int n_codon_pi;
  int pi;
  int l2;
  int l1;
  int l0;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  double local_30;
  int local_20;
  int local_1c;
  int local_18;
  int local_4;
  
  if (in_ESI % 3 == 0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)in_ESI);
    local_18 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(in_ESI + 1));
    local_1c = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(in_ESI + 2));
    local_20 = *pvVar3;
  }
  else if (in_ESI % 3 == 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(in_ESI + -1));
    local_18 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)in_ESI);
    local_1c = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(in_ESI + 1));
    local_20 = *pvVar3;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(in_ESI + -2));
    local_18 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(in_ESI + -1));
    local_1c = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)in_ESI);
    local_20 = *pvVar3;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(long)(in_ESI / 3));
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)iVar1);
  iVar2 = *pvVar3;
  local_30 = -10000000.0;
  local_34 = 0;
  if (((local_18 < 0) || (local_1c < 0)) || (local_20 < 0)) {
    if ((local_18 < 0) || (local_1c < 0)) {
      if ((local_1c < 0) || (local_20 < 0)) {
        if ((local_18 < 0) || (local_20 < 0)) {
          if (local_18 < 0) {
            if (local_1c < 0) {
              if (local_20 < 0) {
                local_4 = max_cai_pos[iVar1];
              }
              else {
                for (local_50 = 0; local_50 < iVar2; local_50 = local_50 + 1) {
                  if ((nucleotides[iVar1][local_50][2] == local_20) &&
                     (local_30 < codon_cai[iVar1][local_50])) {
                    local_30 = codon_cai[iVar1][local_50];
                    local_34 = local_50;
                  }
                }
                local_4 = local_34;
              }
            }
            else {
              for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
                if ((nucleotides[iVar1][local_4c][1] == local_1c) &&
                   (local_30 < codon_cai[iVar1][local_4c])) {
                  local_30 = codon_cai[iVar1][local_4c];
                  local_34 = local_4c;
                }
              }
              local_4 = local_34;
            }
          }
          else {
            for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
              if ((nucleotides[iVar1][local_48][0] == local_18) &&
                 (local_30 < codon_cai[iVar1][local_48])) {
                local_30 = codon_cai[iVar1][local_48];
                local_34 = local_48;
              }
            }
            local_4 = local_34;
          }
        }
        else {
          for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
            if (((nucleotides[iVar1][local_44][0] == local_18) &&
                (nucleotides[iVar1][local_44][2] == local_20)) &&
               (local_30 < codon_cai[iVar1][local_44])) {
              local_30 = codon_cai[iVar1][local_44];
              local_34 = local_44;
            }
          }
          local_4 = local_34;
        }
      }
      else {
        for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
          if (((nucleotides[iVar1][local_40][1] == local_1c) &&
              (nucleotides[iVar1][local_40][2] == local_20)) &&
             (local_30 < codon_cai[iVar1][local_40])) {
            local_30 = codon_cai[iVar1][local_40];
            local_34 = local_40;
          }
        }
        local_4 = local_34;
      }
    }
    else {
      for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
        if (((nucleotides[iVar1][local_3c][0] == local_18) &&
            (nucleotides[iVar1][local_3c][1] == local_1c)) &&
           (local_30 < codon_cai[iVar1][local_3c])) {
          local_30 = codon_cai[iVar1][local_3c];
          local_34 = local_3c;
        }
      }
      local_4 = local_34;
    }
  }
  else {
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      if ((((nucleotides[iVar1][local_38][0] == local_18) &&
           (nucleotides[iVar1][local_38][1] == local_1c)) &&
          (nucleotides[iVar1][local_38][2] == local_20)) && (local_30 < codon_cai[iVar1][local_38]))
      {
        local_30 = codon_cai[iVar1][local_38];
        local_34 = local_38;
      }
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

int Zuker::fill_rna(int index) {
    int l0, l1, l2;
    if (index % 3 == 0) {
        l0 = nucle_seq[index];
        l1 = nucle_seq[index+1];
        l2 = nucle_seq[index+2];
    } else if (index % 3 == 1) {
        l0 = nucle_seq[index-1];
        l1 = nucle_seq[index];
        l2 = nucle_seq[index+1];
    } else {
        l0 = nucle_seq[index-2];
        l1 = nucle_seq[index-1];
        l2 = nucle_seq[index];
    }
    int pi = protein[index/3];
    int n_codon_pi = n_codon[pi];
    double max_cai = -INF;
    int idx = 0;
    // all three nucleotides in codon are specified
    if (l0 >=0 && l1 >= 0 && l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0 && nucleotides[pi][i][1] == l1 && nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // the first two nucleotides in codon are specified
    else if (l0 >=0 && l1 >= 0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0 && nucleotides[pi][i][1] == l1) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // the last two nucleotides in codon are specified
    else if (l1 >= 0 && l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][1] == l1 && nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // the first and the last nucleotides in codon are specified
    else if (l0 >= 0 && l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0 && nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // only the first nucleotide in codon is specified
    else if (l0 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // only the second nucleotide in codon is specified
    else if (l1 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][1] == l1) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // only the third nucleotide in codon is specified
    else if (l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    } else {
        return max_cai_pos[pi];
    }
}